

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindEnumRangeBoundaryFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  reference pvVar2;
  type pEVar3;
  pointer pEVar4;
  pointer pEVar5;
  BinderException *pBVar6;
  string local_98;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  bVar1 = false;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar2);
  CheckEnumParameter(pEVar3);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (pvVar2);
  CheckEnumParameter(pEVar3);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  if ((pEVar4->return_type).id_ != ENUM) {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    LogicalType::LogicalType(&local_48,SQLNULL);
    bVar1 = LogicalType::operator==(&pEVar4->return_type,&local_48);
    bVar1 = !bVar1;
    LogicalType::~LogicalType(&local_48);
  }
  if (bVar1) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"This function needs an ENUM as an argument","");
    BinderException::BinderException(pBVar6,&local_98);
    __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  if ((pEVar4->return_type).id_ == ENUM) {
    bVar1 = false;
  }
  else {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    LogicalType::LogicalType(&local_60,SQLNULL);
    bVar1 = LogicalType::operator==(&pEVar4->return_type,&local_60);
    bVar1 = !bVar1;
    LogicalType::~LogicalType(&local_60);
  }
  if (!bVar1) {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    LogicalType::LogicalType((LogicalType *)&local_98,SQLNULL);
    bVar1 = LogicalType::operator==(&pEVar4->return_type,(LogicalType *)&local_98);
    if (bVar1) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      LogicalType::LogicalType(&local_78,SQLNULL);
      bVar1 = LogicalType::operator==(&pEVar4->return_type,&local_78);
      LogicalType::~LogicalType(&local_78);
    }
    else {
      bVar1 = false;
    }
    LogicalType::~LogicalType((LogicalType *)&local_98);
    if (bVar1 != false) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"This function needs an ENUM as an argument","");
      BinderException::BinderException(pBVar6,&local_98);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    if ((pEVar4->return_type).id_ == ENUM) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,1);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      if ((pEVar4->return_type).id_ == ENUM) {
        pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar2);
        pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,1);
        pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar2);
        bVar1 = LogicalType::operator==(&pEVar4->return_type,&pEVar5->return_type);
        if (!bVar1) {
          pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"The parameters need to link to ONLY one enum OR be NULL ",
                     "");
          BinderException::BinderException(pBVar6,&local_98);
          __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    *(undefined8 *)this = 0;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"This function needs an ENUM as an argument","");
  BinderException::BinderException(pBVar6,&local_98);
  __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindEnumRangeBoundaryFunction(ClientContext &context, ScalarFunction &bound_function,
                                                       vector<unique_ptr<Expression>> &arguments) {
	CheckEnumParameter(*arguments[0]);
	CheckEnumParameter(*arguments[1]);
	if (arguments[0]->return_type.id() != LogicalTypeId::ENUM && arguments[0]->return_type != LogicalType::SQLNULL) {
		throw BinderException("This function needs an ENUM as an argument");
	}
	if (arguments[1]->return_type.id() != LogicalTypeId::ENUM && arguments[1]->return_type != LogicalType::SQLNULL) {
		throw BinderException("This function needs an ENUM as an argument");
	}
	if (arguments[0]->return_type == LogicalType::SQLNULL && arguments[1]->return_type == LogicalType::SQLNULL) {
		throw BinderException("This function needs an ENUM as an argument");
	}
	if (arguments[0]->return_type.id() == LogicalTypeId::ENUM &&
	    arguments[1]->return_type.id() == LogicalTypeId::ENUM &&
	    arguments[0]->return_type != arguments[1]->return_type) {
		throw BinderException("The parameters need to link to ONLY one enum OR be NULL ");
	}
	return nullptr;
}